

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O3

void ihevc_intra_pred_luma_ver_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  bool bVar20;
  long lVar21;
  UWORD8 *pUVar22;
  long lVar23;
  long lVar24;
  WORD32 WVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  
  uVar8 = nt * 2;
  if (nt == 0x20) {
    uVar11 = *(undefined8 *)(pu1_ref + (ulong)uVar8 + 1);
    uVar12 = *(undefined8 *)(pu1_ref + (ulong)uVar8 + 1 + 8);
    uVar13 = *(undefined8 *)(pu1_ref + (ulong)uVar8 + 0x11);
    uVar14 = *(undefined8 *)(pu1_ref + (ulong)uVar8 + 0x11 + 8);
    bVar15 = true;
    do {
      bVar20 = bVar15;
      *(undefined8 *)pu1_dst = uVar11;
      *(undefined8 *)(pu1_dst + 8) = uVar12;
      *(undefined8 *)(pu1_dst + dst_strd) = uVar11;
      *(undefined8 *)(pu1_dst + dst_strd + 8) = uVar12;
      *(undefined8 *)(pu1_dst + dst_strd * 2) = uVar11;
      *(undefined8 *)(pu1_dst + dst_strd * 2 + 8) = uVar12;
      *(undefined8 *)(pu1_dst + dst_strd * 3) = uVar11;
      *(undefined8 *)(pu1_dst + dst_strd * 3 + 8) = uVar12;
      *(undefined8 *)(pu1_dst + dst_strd * 4) = uVar11;
      *(undefined8 *)(pu1_dst + dst_strd * 4 + 8) = uVar12;
      *(undefined8 *)(pu1_dst + dst_strd * 5) = uVar11;
      *(undefined8 *)(pu1_dst + dst_strd * 5 + 8) = uVar12;
      *(undefined8 *)(pu1_dst + dst_strd * 6) = uVar11;
      *(undefined8 *)(pu1_dst + dst_strd * 6 + 8) = uVar12;
      *(undefined8 *)(pu1_dst + dst_strd * 7) = uVar11;
      *(undefined8 *)(pu1_dst + dst_strd * 7 + 8) = uVar12;
      *(undefined8 *)(pu1_dst + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + 0x18) = uVar14;
      *(undefined8 *)(pu1_dst + (long)dst_strd + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)dst_strd + 0x10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 2) + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 2) + 0x10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 3) + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 3) + 0x10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 4) + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 4) + 0x10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 5) + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 5) + 0x10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 6) + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 6) + 0x10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 7) + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 7) + 0x10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + dst_strd * 8) = uVar11;
      *(undefined8 *)(pu1_dst + dst_strd * 8 + 8) = uVar12;
      *(undefined8 *)(pu1_dst + dst_strd * 9) = uVar11;
      *(undefined8 *)(pu1_dst + dst_strd * 9 + 8) = uVar12;
      *(undefined8 *)(pu1_dst + dst_strd * 10) = uVar11;
      *(undefined8 *)(pu1_dst + dst_strd * 10 + 8) = uVar12;
      *(undefined8 *)(pu1_dst + dst_strd * 0xb) = uVar11;
      *(undefined8 *)(pu1_dst + dst_strd * 0xb + 8) = uVar12;
      *(undefined8 *)(pu1_dst + dst_strd * 0xc) = uVar11;
      *(undefined8 *)(pu1_dst + dst_strd * 0xc + 8) = uVar12;
      *(undefined8 *)(pu1_dst + dst_strd * 0xd) = uVar11;
      *(undefined8 *)(pu1_dst + dst_strd * 0xd + 8) = uVar12;
      *(undefined8 *)(pu1_dst + dst_strd * 0xe) = uVar11;
      *(undefined8 *)(pu1_dst + dst_strd * 0xe + 8) = uVar12;
      *(undefined8 *)(pu1_dst + dst_strd * 0xf) = uVar11;
      *(undefined8 *)(pu1_dst + dst_strd * 0xf + 8) = uVar12;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 8) + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 8) + 0x10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 9) + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 9) + 0x10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 10) + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 10) + 0x10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xb) + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xb) + 0x10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xc) + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xc) + 0x10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xd) + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xd) + 0x10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xe) + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xe) + 0x10 + 8) = uVar14;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xf) + 0x10) = uVar13;
      *(undefined8 *)(pu1_dst + (long)(dst_strd * 0xf) + 0x10 + 8) = uVar14;
      pu1_dst = pu1_dst + dst_strd * 0x10;
      bVar15 = false;
    } while (bVar20);
  }
  else {
    if (0 < nt) {
      uVar17 = (ulong)(uint)nt + 1;
      pUVar22 = pu1_dst + ((ulong)(uint)nt - 1) * (long)dst_strd;
      WVar25 = nt;
      do {
        iVar19 = ((int)((uint)pu1_ref[WVar25] - (uint)pu1_ref[uVar8]) >> 1) +
                 (uint)pu1_ref[(ulong)uVar8 | 1];
        if ((short)iVar19 < 1) {
          iVar19 = 0;
        }
        if (0xfe < (short)iVar19) {
          iVar19 = 0xff;
        }
        *pUVar22 = (UWORD8)iVar19;
        uVar17 = uVar17 - 1;
        WVar25 = WVar25 + 1;
        pUVar22 = pUVar22 + -(long)dst_strd;
      } while (1 < uVar17);
    }
    if (nt == 4) {
      uVar8 = *(uint *)(pu1_ref + (ulong)uVar8 + 1);
      lVar16 = (long)dst_strd;
      bVar1 = pu1_dst[lVar16];
      bVar2 = pu1_dst[lVar16 * 2];
      bVar3 = pu1_dst[lVar16 * 3];
      *(uint *)pu1_dst = uVar8 & 0xffffff00 | (uint)*pu1_dst;
      *(uint *)(pu1_dst + lVar16) = uVar8 & 0xffffff00 | (uint)bVar1;
      *(uint *)(pu1_dst + lVar16 * 2) = uVar8 & 0xffffff00 | (uint)bVar2;
      *(uint *)(pu1_dst + lVar16 * 3) = uVar8 & 0xffffff00 | (uint)bVar3;
    }
    else if (nt == 8) {
      uVar17 = *(ulong *)(pu1_ref + (ulong)uVar8 + 1);
      lVar16 = (long)dst_strd;
      bVar1 = pu1_dst[lVar16];
      bVar2 = pu1_dst[lVar16 * 2];
      bVar3 = pu1_dst[lVar16 * 3];
      bVar4 = pu1_dst[lVar16 * 4];
      bVar5 = pu1_dst[lVar16 * 5];
      bVar6 = pu1_dst[lVar16 * 6];
      bVar7 = pu1_dst[lVar16 * 7];
      *(ulong *)pu1_dst = uVar17 & 0xffffffffffffff00 | (ulong)*pu1_dst;
      *(ulong *)(pu1_dst + lVar16) = uVar17 & 0xffffffffffffff00 | (ulong)bVar1;
      *(ulong *)(pu1_dst + lVar16 * 2) = uVar17 & 0xffffffffffffff00 | (ulong)bVar2;
      *(ulong *)(pu1_dst + lVar16 * 3) = uVar17 & 0xffffffffffffff00 | (ulong)bVar3;
      *(ulong *)(pu1_dst + lVar16 * 4) = uVar17 & 0xffffffffffffff00 | (ulong)bVar4;
      *(ulong *)(pu1_dst + lVar16 * 5) = uVar17 & 0xffffffffffffff00 | (ulong)bVar5;
      *(ulong *)(pu1_dst + lVar16 * 6) = uVar17 & 0xffffffffffffff00 | (ulong)bVar6;
      *(ulong *)(pu1_dst + lVar16 * 7) = uVar17 & 0xffffffffffffff00 | (ulong)bVar7;
    }
    else if (nt == 0x10) {
      lVar16 = (long)dst_strd;
      uVar17 = 0;
      bVar15 = true;
      do {
        bVar20 = bVar15;
        uVar9 = *(ulong *)(pu1_ref + (ulong)uVar8 + 1);
        uVar10 = *(ulong *)((long)(pu1_ref + (ulong)uVar8 + 1) + 8);
        lVar23 = (uVar17 | 1) * lVar16;
        bVar1 = pu1_dst[lVar23];
        lVar24 = (uVar17 | 2) * lVar16;
        bVar2 = pu1_dst[lVar24];
        lVar18 = (uVar17 | 3) * lVar16;
        bVar3 = pu1_dst[lVar18];
        lVar27 = (uVar17 | 4) * lVar16;
        bVar4 = pu1_dst[lVar27];
        lVar28 = (uVar17 | 5) * lVar16;
        bVar5 = pu1_dst[lVar28];
        lVar26 = (uVar17 | 6) * lVar16;
        bVar6 = pu1_dst[lVar26];
        lVar21 = (uVar17 | 7) * lVar16;
        bVar7 = pu1_dst[lVar21];
        *(ulong *)(pu1_dst + uVar17 * lVar16) =
             uVar9 & 0xffffffffffffff00 | (ulong)pu1_dst[uVar17 * lVar16];
        *(ulong *)((long)(pu1_dst + uVar17 * lVar16) + 8) = uVar10;
        *(ulong *)(pu1_dst + lVar23) = uVar9 & 0xffffffffffffff00 | (ulong)bVar1;
        *(ulong *)((long)(pu1_dst + lVar23) + 8) = uVar10;
        *(ulong *)(pu1_dst + lVar24) = uVar9 & 0xffffffffffffff00 | (ulong)bVar2;
        *(ulong *)((long)(pu1_dst + lVar24) + 8) = uVar10;
        *(ulong *)(pu1_dst + lVar18) = uVar9 & 0xffffffffffffff00 | (ulong)bVar3;
        *(ulong *)((long)(pu1_dst + lVar18) + 8) = uVar10;
        *(ulong *)(pu1_dst + lVar27) = uVar9 & 0xffffffffffffff00 | (ulong)bVar4;
        *(ulong *)((long)(pu1_dst + lVar27) + 8) = uVar10;
        *(ulong *)(pu1_dst + lVar28) = uVar9 & 0xffffffffffffff00 | (ulong)bVar5;
        *(ulong *)((long)(pu1_dst + lVar28) + 8) = uVar10;
        *(ulong *)(pu1_dst + lVar26) = uVar9 & 0xffffffffffffff00 | (ulong)bVar6;
        *(ulong *)((long)(pu1_dst + lVar26) + 8) = uVar10;
        *(ulong *)(pu1_dst + lVar21) = uVar9 & 0xffffffffffffff00 | (ulong)bVar7;
        *(ulong *)((long)(pu1_dst + lVar21) + 8) = uVar10;
        uVar17 = 8;
        bVar15 = false;
      } while (bVar20);
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_ver_sse42(UWORD8 *pu1_ref,
                                     WORD32 src_strd,
                                     UWORD8 *pu1_dst,
                                     WORD32 dst_strd,
                                     WORD32 nt,
                                     WORD32 mode)
{
    WORD32 row;
    WORD16 s2_predpixel;
    WORD32 two_nt = 2 * nt;
    __m128i src_temp0, src_temp1, src_temp2, src_temp3, src_temp4, src_temp5, src_temp6, src_temp7;

    UNUSED(src_strd);
    UNUSED(mode);

    if(nt == 32)
    {
        __m128i temp1, temp2;
        WORD32 itr_count;

        temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
        temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 16));

        for(itr_count = 0; itr_count < 2; itr_count++)
        {
            /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
            _mm_storeu_si128((__m128i *)(pu1_dst + ((0) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), temp1);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((0) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((1) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((2) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((3) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((4) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((5) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((6) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((7) * dst_strd)), temp2);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), temp1);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((8) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((9) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((10) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((11) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((12) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((13) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((14) * dst_strd)), temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((15) * dst_strd)), temp2);

            pu1_dst += 16 * dst_strd;
        }
    }

    else

    {
        /*Filtering done for the 1st column */
        for(row = nt - 1; row >= 0; row--)
        {
            s2_predpixel = pu1_ref[two_nt + 1]
                            + ((pu1_ref[two_nt - 1 - row] - pu1_ref[two_nt]) >> 1);
            pu1_dst[row * dst_strd] = CLIP_U8(s2_predpixel);
        }

        /* Replication to next columns*/

        if(nt == 4)
        {
            int temp1, temp2, temp3, temp4;

            src_temp2 =   _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp3 =  src_temp2;
            src_temp4 =  src_temp2;
            src_temp5 =  src_temp2;

            src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[(0 * dst_strd)], 0);
            src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[(1 * dst_strd)], 0);
            src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[(2 * dst_strd)], 0);
            src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[(3 * dst_strd)], 0);

            temp1 = _mm_cvtsi128_si32(src_temp2);
            temp2 = _mm_cvtsi128_si32(src_temp3);
            temp3 = _mm_cvtsi128_si32(src_temp4);
            temp4 = _mm_cvtsi128_si32(src_temp5);

            /* loding 4-bit 8 pixels values */
            *(WORD32 *)(&pu1_dst[(0 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp3;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp4;

        }
        else if(nt == 8)
        {

            src_temp0 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp1 = src_temp0;
            src_temp2 = src_temp0;
            src_temp3 = src_temp0;
            src_temp4 = src_temp0;
            src_temp5 = src_temp0;
            src_temp6 = src_temp0;
            src_temp7 = src_temp0;

            src_temp0 = _mm_insert_epi8(src_temp0, pu1_dst[((0) * dst_strd)], 0);
            src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((1) * dst_strd)], 0);
            src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[((2) * dst_strd)], 0);
            src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[((3) * dst_strd)], 0);
            src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[((4) * dst_strd)], 0);
            src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[((5) * dst_strd)], 0);
            src_temp6 = _mm_insert_epi8(src_temp6, pu1_dst[((6) * dst_strd)], 0);
            src_temp7 = _mm_insert_epi8(src_temp7, pu1_dst[((7) * dst_strd)], 0);

            _mm_storel_epi64((__m128i *)(pu1_dst + ((0) * dst_strd)), src_temp0);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);


        }
        else if(nt == 16)
        {
            for(row = 0; row < nt; row += 8)
            {

                src_temp0 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
                src_temp1 = src_temp0;
                src_temp2 = src_temp0;
                src_temp3 = src_temp0;
                src_temp4 = src_temp0;
                src_temp5 = src_temp0;
                src_temp6 = src_temp0;
                src_temp7 = src_temp0;

                src_temp0 = _mm_insert_epi8(src_temp0, pu1_dst[((row + 0) * dst_strd)], 0);
                src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((row + 1) * dst_strd)], 0);
                src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[((row + 2) * dst_strd)], 0);
                src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[((row + 3) * dst_strd)], 0);
                src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[((row + 4) * dst_strd)], 0);
                src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[((row + 5) * dst_strd)], 0);
                src_temp6 = _mm_insert_epi8(src_temp6, pu1_dst[((row + 6) * dst_strd)], 0);
                src_temp7 = _mm_insert_epi8(src_temp7, pu1_dst[((row + 7) * dst_strd)], 0);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), src_temp0);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 4) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 7) * dst_strd)), src_temp7);

            }

        }


    }
}